

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O3

TrackSet<ASDCP::MXF::TimecodeComponent> * __thiscall
ASDCP::MXF::CreateTrackAndSequence<ASDCP::MXF::MaterialPackage,ASDCP::MXF::TimecodeComponent>
          (TrackSet<ASDCP::MXF::TimecodeComponent> *__return_storage_ptr__,MXF *this,
          OP1aHeader *Header,MaterialPackage *Package,string *TrackName,Rational *clip_edit_rate,
          UL *Definition,ui32_t TrackID,Dictionary *Dict)

{
  undefined8 uVar1;
  Dictionary *pDVar2;
  Track *this_00;
  Sequence *this_01;
  undefined4 in_stack_00000014;
  UTF16String local_58 [8];
  long *local_50;
  long local_40 [2];
  
  pDVar2 = (Dictionary *)CONCAT44(in_stack_00000014,TrackID);
  __return_storage_ptr__->Track = (Track *)0x0;
  __return_storage_ptr__->Sequence = (Sequence *)0x0;
  __return_storage_ptr__->Clip = (TimecodeComponent *)0x0;
  this_00 = (Track *)operator_new(0x118);
  ASDCP::MXF::Track::Track(this_00,pDVar2);
  __return_storage_ptr__->Track = this_00;
  (**(code **)(*(long *)this + 0x68))(this,this_00);
  *(size_type *)(this_00 + 0x108) = TrackName->_M_string_length;
  std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
            ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)(Header + 0x138),
             (value_type *)(this_00 + 0x58));
  *(undefined4 *)(this_00 + 0xa0) = Definition._0_4_;
  ASDCP::MXF::UTF16String::UTF16String(local_58,*(char **)Package);
  std::__cxx11::string::_M_assign((string *)(this_00 + 0xb0));
  this_00[0xd0] = (Track)0x1;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  this_01 = (Sequence *)operator_new(0xf0);
  ASDCP::MXF::Sequence::Sequence(this_01,(Dictionary *)CONCAT44(in_stack_00000014,TrackID));
  __return_storage_ptr__->Sequence = this_01;
  (**(code **)(*(long *)this + 0x68))(this,this_01);
  this_00[0xe0] = *(Track *)(this_01 + 0x60);
  uVar1 = *(undefined8 *)(this_01 + 0x69);
  *(undefined8 *)(this_00 + 0xe1) = *(undefined8 *)(this_01 + 0x61);
  *(undefined8 *)(this_00 + 0xe9) = uVar1;
  this_00[0xf8] = (Track)0x1;
  this_01[0xa8] = *(Sequence *)&(clip_edit_rate->super_Rational).Numerator;
  uVar1 = *(undefined8 *)((long)&clip_edit_rate[1].super_IArchive._vptr_IArchive + 1);
  *(undefined8 *)(this_01 + 0xa9) =
       *(undefined8 *)((long)&(clip_edit_rate->super_Rational).Numerator + 1);
  *(undefined8 *)(this_01 + 0xb1) = uVar1;
  return __return_storage_ptr__;
}

Assistant:

TrackSet<ClipT>
	CreateTrackAndSequence(OP1aHeader& Header, PackageT& Package, const std::string TrackName,
			       const MXF::Rational& clip_edit_rate, const UL& Definition, ui32_t TrackID, const Dictionary *Dict)
	{
	  TrackSet<ClipT> NewTrack;

	  NewTrack.Track = new Track(Dict);
	  Header.AddChildObject(NewTrack.Track);
	  NewTrack.Track->EditRate = clip_edit_rate;
	  Package.Tracks.push_back(NewTrack.Track->InstanceUID);
	  NewTrack.Track->TrackID = TrackID;
	  NewTrack.Track->TrackName = TrackName.c_str();

	  NewTrack.Sequence = new Sequence(Dict);
	  Header.AddChildObject(NewTrack.Sequence);
	  NewTrack.Track->Sequence = NewTrack.Sequence->InstanceUID;
	  NewTrack.Sequence->DataDefinition = Definition;

	  return NewTrack;
	}